

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFileSetGenerator.cxx
# Opt level: O0

bool __thiscall
cmInstallFileSetGenerator::Compute(cmInstallFileSetGenerator *this,cmLocalGenerator *lg)

{
  cmGeneratorTarget *pcVar1;
  cmGlobalGenerator *this_00;
  cmLocalGenerator *lg_local;
  cmInstallFileSetGenerator *this_local;
  
  this->LocalGenerator = lg;
  pcVar1 = cmLocalGenerator::FindLocalNonAliasGeneratorTarget(lg,&this->TargetName);
  this->Target = pcVar1;
  if (this->Target == (cmGeneratorTarget *)0x0) {
    this_00 = cmLocalGenerator::GetGlobalGenerator(lg);
    pcVar1 = cmGlobalGenerator::FindGeneratorTarget(this_00,&this->TargetName);
    this->Target = pcVar1;
  }
  return true;
}

Assistant:

bool cmInstallFileSetGenerator::Compute(cmLocalGenerator* lg)
{
  this->LocalGenerator = lg;

  // Lookup this target in the current directory.
  this->Target = lg->FindLocalNonAliasGeneratorTarget(this->TargetName);
  if (!this->Target) {
    // If no local target has been found, find it in the global scope.
    this->Target =
      lg->GetGlobalGenerator()->FindGeneratorTarget(this->TargetName);
  }

  return true;
}